

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

int32_t argv2int(jit_State *J,TValue *o)

{
  int iVar1;
  bool bVar2;
  TValue *o_local;
  jit_State *J_local;
  
  bVar2 = true;
  if ((0xfffffff2 < (uint)((int)(o->field_4).it >> 0xf)) &&
     (bVar2 = false, (int)(o->field_4).it >> 0xf == -5)) {
    iVar1 = lj_strscan_num((GCstr *)(o->u64 & 0x7fffffffffff),o);
    bVar2 = iVar1 != 0;
  }
  if (bVar2) {
    return (int)o->n;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

static int32_t argv2int(jit_State *J, TValue *o)
{
  if (!lj_strscan_numberobj(o))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  return tvisint(o) ? intV(o) : lj_num2int(numV(o));
}